

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void testDifferentPacketConfigWorks(void)

{
  bool bVar1;
  ostream *poVar2;
  bool condition;
  string *in_stack_00000098;
  allocator local_29;
  string local_28 [39];
  undefined1 local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"content",&local_29);
  bVar1 = checkSerializeAndUnserialize<packet::PacketT<testDifferentPacketConfigWorks()::TestConfig>>
                    (in_stack_00000098);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  if (!bVar1) {
    local_1 = bVar1;
    poVar2 = std::operator<<((ostream *)&std::cerr,"[");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,"testDifferentPacketConfigWorks");
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x39);
    std::operator<<(poVar2,
                    "] TEST_ASSERT failed checkSerializeAndUnserialize<Packet>(\"content\")\n");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/agudpp[P]packet/src/test.cpp"
                  ,0x39,"void testDifferentPacketConfigWorks()");
  }
  return;
}

Assistant:

void
testDifferentPacketConfigWorks()
{
    // serialize a pakcet with different configuration should work
    struct TestConfig : packet::ConfigT<
            packet::DefaultStartPattern,
            packet::DefaultEndPattern,
            std::uint32_t,
            10
            >{};
    using Packet = packet::PacketT<TestConfig>;

    TEST_ASSERT(checkSerializeAndUnserialize<Packet>("content"));
}